

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O2

void __thiscall QTextEdit::resizeEvent(QTextEdit *this,QResizeEvent *e)

{
  QTextEditPrivate *this_00;
  char cVar1;
  int iVar2;
  LineWrapMode LVar3;
  long in_FS_OFFSET;
  double dVar4;
  double in_XMM1_Qa;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  LVar3 = this_00->lineWrap;
  if (LVar3 == NoWrap) {
    QWidgetTextControl::document((QWidgetTextControl *)this_00->control);
    local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextDocument::documentLayout();
    QObject::property((char *)local_48.data);
    dVar4 = (double)QTextDocument::pageSize();
    if ((((dVar4 != 0.0) || (NAN(dVar4))) || (in_XMM1_Qa != 0.0)) || (NAN(in_XMM1_Qa))) {
      iVar2 = ::QVariant::typeId((QVariant *)&local_48);
      if (iVar2 == 1) {
        cVar1 = ::QVariant::toBool();
        if (cVar1 == '\0') {
          QTextEditPrivate::adjustScrollbars(this_00);
          ::QVariant::~QVariant((QVariant *)&local_48);
          goto LAB_00461125;
        }
      }
    }
    ::QVariant::~QVariant((QVariant *)&local_48);
    LVar3 = this_00->lineWrap;
  }
  if ((LVar3 == FixedPixelWidth) || (*(int *)(e + 0x18) == *(int *)(e + 0x10))) {
    QTextEditPrivate::adjustScrollbars(this_00);
  }
  else {
    QTextEditPrivate::relayoutDocument(this_00);
  }
LAB_00461125:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEdit::resizeEvent(QResizeEvent *e)
{
    Q_D(QTextEdit);

    if (d->lineWrap == NoWrap) {
        QTextDocument *doc = d->control->document();
        QVariant alignmentProperty = doc->documentLayout()->property("contentHasAlignment");

        if (!doc->pageSize().isNull()
            && alignmentProperty.userType() == QMetaType::Bool
            && !alignmentProperty.toBool()) {

            d->adjustScrollbars();
            return;
        }
    }

    if (d->lineWrap != FixedPixelWidth
        && e->oldSize().width() != e->size().width())
        d->relayoutDocument();
    else
        d->adjustScrollbars();
}